

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOAnimation.cpp
# Opt level: O2

void __thiscall
Assimp::LWO::AnimResolver::AnimResolver
          (AnimResolver *this,
          list<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *_envelopes,
          double tick)

{
  double dVar1;
  double dVar2;
  Envelope **ppEVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  undefined4 uVar6;
  undefined4 uVar7;
  
  this->envelopes = _envelopes;
  this->flags = 0;
  this->sample_delta = 0.0;
  this->sample_rate = 0.0;
  this->trans_x = (Envelope *)0x0;
  this->trans_y = (Envelope *)0x0;
  this->trans_z = (Envelope *)0x0;
  this->rotat_x = (Envelope *)0x0;
  this->rotat_y = (Envelope *)0x0;
  this->rotat_z = (Envelope *)0x0;
  this->scale_x = (Envelope *)0x0;
  this->scale_y = (Envelope *)0x0;
  this->scale_z = (Envelope *)0x0;
  this->envl_x = (Envelope *)0x0;
  this->envl_y = (Envelope *)0x0;
  this->envl_z = (Envelope *)0x0;
  (this->cur_x)._M_current = (Key *)0x0;
  (this->cur_y)._M_current = (Key *)0x0;
  (this->cur_z)._M_current = (Key *)0x0;
  *(undefined4 *)((long)&(this->cur_z)._M_current + 7) = 0;
  this->first = 150392.0;
  this->last = 150392.0;
  p_Var5 = (_List_node_base *)_envelopes;
  do {
    p_Var5 = (((_List_base<Assimp::LWO::Envelope,_std::allocator<Assimp::LWO::Envelope>_> *)
              &p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var5 == (_List_node_base *)_envelopes) {
      this->need_to_setup = true;
      return;
    }
    p_Var5[3]._M_prev = (_List_node_base *)0x0;
    p_Var4 = p_Var5[2]._M_prev;
    p_Var5[4]._M_next = (_List_node_base *)(((long)p_Var4 - (long)p_Var5[2]._M_next) / 0x28 + -1);
    if (p_Var4 != p_Var5[2]._M_next) {
      ppEVar3 = &this->trans_x;
      switch(*(undefined4 *)((long)&p_Var5[1]._M_next + 4)) {
      case 1:
        break;
      case 2:
        ppEVar3 = &this->trans_y;
        break;
      case 3:
        ppEVar3 = &this->trans_z;
        break;
      case 4:
        ppEVar3 = &this->rotat_x;
        break;
      case 5:
        ppEVar3 = &this->rotat_y;
        break;
      case 6:
        ppEVar3 = &this->rotat_z;
        break;
      case 7:
        ppEVar3 = &this->scale_x;
        break;
      case 8:
        ppEVar3 = &this->scale_y;
        break;
      case 9:
        ppEVar3 = &this->scale_z;
        break;
      default:
        goto switchD_00573858_default;
      }
      *ppEVar3 = (Envelope *)(p_Var5 + 1);
      for (p_Var4 = p_Var5[2]._M_next; p_Var4 != p_Var5[2]._M_prev;
          p_Var4 = (_List_node_base *)((long)(p_Var4 + 2) + 8)) {
        p_Var4->_M_next = (_List_node_base *)((double)p_Var4->_M_next * tick);
      }
      dVar1 = *(double *)p_Var5[2]._M_next;
      uVar6 = SUB84(dVar1,0);
      uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      dVar2 = this->first;
      if (dVar2 <= dVar1) {
        uVar6 = SUB84(dVar2,0);
        uVar7 = (undefined4)((ulong)dVar2 >> 0x20);
      }
      this->first = (double)CONCAT44(uVar7,uVar6);
      p_Var4 = *(_List_node_base **)((long)(p_Var5[2]._M_prev + 0xfffffffffffffffd) + 8);
      uVar6 = SUB84(p_Var4,0);
      uVar7 = (undefined4)((ulong)p_Var4 >> 0x20);
      dVar1 = this->last;
      if ((double)p_Var4 <= dVar1) {
        uVar6 = SUB84(dVar1,0);
        uVar7 = (undefined4)((ulong)dVar1 >> 0x20);
      }
      this->last = (double)CONCAT44(uVar7,uVar6);
    }
switchD_00573858_default:
    _envelopes = this->envelopes;
  } while( true );
}

Assistant:

AnimResolver::AnimResolver(std::list<Envelope>& _envelopes,double tick)
    : envelopes   (_envelopes)
    , sample_rate (0.)
    , envl_x(), envl_y(), envl_z()
    , end_x(), end_y(), end_z()
    , flags()
    , sample_delta()
{
    trans_x = trans_y = trans_z = NULL;
    rotat_x = rotat_y = rotat_z = NULL;
    scale_x = scale_y = scale_z = NULL;

    first = last = 150392.;

    // find transformation envelopes
    for (std::list<LWO::Envelope>::iterator it = envelopes.begin(); it != envelopes.end(); ++it) {

        (*it).old_first = 0;
        (*it).old_last  = (*it).keys.size()-1;

        if ((*it).keys.empty()) continue;
        switch ((*it).type) {

            // translation
            case LWO::EnvelopeType_Position_X:
                trans_x = &*it;break;
            case LWO::EnvelopeType_Position_Y:
                trans_y = &*it;break;
            case LWO::EnvelopeType_Position_Z:
                trans_z = &*it;break;

                // rotation
            case LWO::EnvelopeType_Rotation_Heading:
                rotat_x = &*it;break;
            case LWO::EnvelopeType_Rotation_Pitch:
                rotat_y = &*it;break;
            case LWO::EnvelopeType_Rotation_Bank:
                rotat_z = &*it;break;

                // scaling
            case LWO::EnvelopeType_Scaling_X:
                scale_x = &*it;break;
            case LWO::EnvelopeType_Scaling_Y:
                scale_y = &*it;break;
            case LWO::EnvelopeType_Scaling_Z:
                scale_z = &*it;break;
            default:
                continue;
        };

        // convert from seconds to ticks
        for (std::vector<LWO::Key>::iterator d = (*it).keys.begin(); d != (*it).keys.end(); ++d)
            (*d).time *= tick;

        // set default animation range (minimum and maximum time value for which we have a keyframe)
        first = std::min(first, (*it).keys.front().time );
        last  = std::max(last,  (*it).keys.back().time );
    }

    // deferred setup of animation range to increase performance.
    // typically the application will want to specify its own.
    need_to_setup = true;
}